

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

PCRE2_SPTR16
compile_ref_iterator_matchingpath(compiler_common *common,PCRE2_SPTR16 cc,backtrack_common *parent)

{
  ushort uVar1;
  sljit_compiler *compiler_00;
  sljit_s32 sVar2;
  backtrack_common *__s;
  sljit_label *psVar3;
  sljit_jump *psVar4;
  sljit_jump *jump_00;
  sljit_label *label_00;
  backtrack_common *pbVar5;
  int size;
  bool bVar6;
  uint local_70;
  BOOL minimize;
  int max;
  int min;
  PCRE2_SPTR16 ccbegin;
  sljit_jump *jump;
  sljit_jump *zerolength;
  sljit_label *label;
  int offset;
  PCRE2_UCHAR16 type;
  backtrack_common *backtrack;
  BOOL ref;
  sljit_compiler *compiler;
  backtrack_common *parent_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  bVar6 = true;
  if (*cc != 0x71) {
    bVar6 = *cc == 0x72;
  }
  label._0_4_ = 0;
  ccbegin = (PCRE2_SPTR16)0x0;
  minimize = 0;
  local_70 = 0;
  __s = (backtrack_common *)sljit_alloc_memory(compiler_00,0x30);
  sVar2 = sljit_get_compiler_error(compiler_00);
  if (sVar2 == 0) {
    memset(__s,0,0x30);
    __s->prev = parent->top;
    __s->cc = cc;
    parent->top = __s;
    if (bVar6) {
      label._0_4_ = (uint)cc[1] << 1;
      parent_local = (backtrack_common *)cc;
    }
    else {
      parent_local = (backtrack_common *)(cc + 1);
    }
    uVar1 = *(ushort *)((long)&parent_local->prev + 4);
    switch(uVar1) {
    case 0x62:
    case 99:
      minimize = 0;
      local_70 = 0;
      parent_local = (backtrack_common *)((long)&parent_local->prev + 6);
      break;
    case 100:
    case 0x65:
      minimize = 1;
      local_70 = 0;
      parent_local = (backtrack_common *)((long)&parent_local->prev + 6);
      break;
    case 0x66:
    case 0x67:
      minimize = 0;
      local_70 = 1;
      parent_local = (backtrack_common *)((long)&parent_local->prev + 6);
      break;
    case 0x68:
    case 0x69:
      minimize = (BOOL)*(ushort *)((long)&parent_local->prev + 6);
      local_70 = (uint)*(ushort *)&parent_local->nextbacktracks;
      parent_local = (backtrack_common *)((long)&parent_local->nextbacktracks + 2);
    }
    if ((uVar1 & 1) == 0) {
      if (minimize == 0) {
        allocate_stack(common,2);
        if (bVar6) {
          sljit_emit_op1(compiler_00,0x20,1,0,0x8e,
                         (long)common->ovector_start + (long)(int)label * 8);
        }
        sljit_emit_op1(compiler_00,0x20,0x8c,0,2,0);
        sljit_emit_op1(compiler_00,0x20,0x8c,8,0x40,0);
        sljit_emit_op2(compiler_00,0x60,0xc,0,0xc,0,0x40,8);
        if (bVar6) {
          jump = sljit_emit_cmp(compiler_00,0,1,0,0x8e,
                                (long)common->ovector_start + (long)((int)label + 1) * 8);
        }
        else {
          compile_dnref_search(common,cc,(jump_list **)0x0);
          sljit_emit_op1(compiler_00,0x20,1,0,0x84,0);
          sljit_emit_op1(compiler_00,0x20,0x8e,0x18,4,0);
          jump = sljit_emit_cmp(compiler_00,0,1,0,0x84,8);
        }
        sljit_emit_op2(compiler_00,0x62,0xc,0,0xc,0,0x40,8);
      }
      else {
        allocate_stack(common,1);
        if (bVar6) {
          sljit_emit_op1(compiler_00,0x20,1,0,0x8e,
                         (long)common->ovector_start + (long)(int)label * 8);
        }
        sljit_emit_op1(compiler_00,0x20,0x8c,0,0x40,0);
        if (bVar6) {
          psVar4 = sljit_emit_cmp(compiler_00,0,1,0,0x8e,(long)common->ovector_start + 8);
          add_jump(compiler_00,&__s->topbacktracks,psVar4);
          jump = sljit_emit_cmp(compiler_00,0,1,0,0x8e,
                                (long)common->ovector_start + (long)((int)label + 1) * 8);
        }
        else {
          compile_dnref_search(common,cc,&__s->topbacktracks);
          sljit_emit_op1(compiler_00,0x20,1,0,0x84,0);
          sljit_emit_op1(compiler_00,0x20,0x8e,0x18,4,0);
          jump = sljit_emit_cmp(compiler_00,0,1,0,0x84,8);
        }
      }
      if ((1 < (uint)minimize) || (1 < local_70)) {
        sljit_emit_op1(compiler_00,0x20,0x8e,0x10,0x40,0);
      }
      psVar3 = sljit_emit_label(compiler_00);
      if (!bVar6) {
        sljit_emit_op1(compiler_00,0x20,4,0,0x8e,0x18);
      }
      compile_ref_matchingpath(common,cc,&__s->topbacktracks,0,0);
      if ((1 < (uint)minimize) || (1 < local_70)) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,0x10);
        sljit_emit_op2(compiler_00,0x60,1,0,1,0,0x40,1);
        sljit_emit_op1(compiler_00,0x20,0x8e,0x10,1,0);
        if (1 < (uint)minimize) {
          psVar4 = sljit_emit_cmp(compiler_00,2,1,0,0x40,(long)minimize);
          sljit_set_label(psVar4,psVar3);
        }
        if (1 < local_70) {
          psVar4 = sljit_emit_cmp(compiler_00,3,1,0,0x40,(long)(int)local_70);
          allocate_stack(common,1);
          sljit_emit_op1(compiler_00,0x20,0x8c,0,2,0);
          jump_00 = sljit_emit_jump(compiler_00,0x18);
          sljit_set_label(jump_00,psVar3);
          label_00 = sljit_emit_label(compiler_00);
          sljit_set_label(psVar4,label_00);
        }
      }
      if (local_70 == 0) {
        allocate_stack(common,1);
        sljit_emit_op1(compiler_00,0x20,0x8c,0,2,0);
        psVar4 = sljit_emit_jump(compiler_00,0x18);
        sljit_set_label(psVar4,psVar3);
      }
      psVar3 = sljit_emit_label(compiler_00);
      sljit_set_label(jump,psVar3);
      pbVar5 = (backtrack_common *)sljit_emit_label(compiler_00);
      __s[1].prev = pbVar5;
      count_match(common);
      common_local = (compiler_common *)parent_local;
    }
    else {
      size = 3;
      if (bVar6) {
        size = 2;
      }
      allocate_stack(common,size);
      if (bVar6) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->ovector_start + (long)(int)label * 8)
        ;
      }
      sljit_emit_op1(compiler_00,0x20,0x8c,0,0x40,0);
      if (uVar1 != 99) {
        sljit_emit_op1(compiler_00,0x20,0x8c,8,0x40,0);
      }
      if (minimize == 0) {
        if (bVar6) {
          jump = sljit_emit_cmp(compiler_00,0,1,0,0x8e,
                                (long)common->ovector_start + (long)((int)label + 1) * 8);
        }
        else {
          compile_dnref_search(common,cc,(jump_list **)0x0);
          sljit_emit_op1(compiler_00,0x20,1,0,0x84,0);
          sljit_emit_op1(compiler_00,0x20,0x8c,0x10,4,0);
          jump = sljit_emit_cmp(compiler_00,0,1,0,0x84,8);
        }
        sljit_emit_op1(compiler_00,0x20,0x8c,0,2,0);
        ccbegin = (PCRE2_SPTR16)sljit_emit_jump(compiler_00,0x18);
      }
      else if (bVar6) {
        psVar4 = sljit_emit_cmp(compiler_00,0,1,0,0x8e,(long)common->ovector_start + 8);
        add_jump(compiler_00,&__s->topbacktracks,psVar4);
        jump = sljit_emit_cmp(compiler_00,0,1,0,0x8e,
                              (long)common->ovector_start + (long)((int)label + 1) * 8);
      }
      else {
        compile_dnref_search(common,cc,&__s->topbacktracks);
        sljit_emit_op1(compiler_00,0x20,1,0,0x84,0);
        sljit_emit_op1(compiler_00,0x20,0x8c,0x10,4,0);
        jump = sljit_emit_cmp(compiler_00,0,1,0,0x84,8);
      }
      pbVar5 = (backtrack_common *)sljit_emit_label(compiler_00);
      __s[1].prev = pbVar5;
      if (local_70 != 0) {
        psVar4 = sljit_emit_cmp(compiler_00,3,0x8c,8,0x40,(long)(int)local_70);
        add_jump(compiler_00,&__s->topbacktracks,psVar4);
      }
      if (!bVar6) {
        sljit_emit_op1(compiler_00,0x20,4,0,0x8c,0x10);
      }
      compile_ref_matchingpath(common,cc,&__s->topbacktracks,1,1);
      sljit_emit_op1(compiler_00,0x20,0x8c,0,2,0);
      if ((uint)minimize < 2) {
        if (local_70 != 0) {
          sljit_emit_op2(compiler_00,0x60,0x8c,8,0x8c,8,0x40,1);
        }
      }
      else {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8c,8);
        sljit_emit_op2(compiler_00,0x60,1,0,1,0,0x40,1);
        sljit_emit_op1(compiler_00,0x20,0x8c,8,1,0);
        psVar4 = sljit_emit_cmp(compiler_00,2,1,0,0x40,(long)minimize);
        sljit_set_label(psVar4,(sljit_label *)__s[1].prev);
      }
      if (ccbegin != (PCRE2_SPTR16)0x0) {
        psVar3 = sljit_emit_label(compiler_00);
        sljit_set_label((sljit_jump *)ccbegin,psVar3);
      }
      psVar3 = sljit_emit_label(compiler_00);
      sljit_set_label(jump,psVar3);
      count_match(common);
      common_local = (compiler_common *)parent_local;
    }
  }
  else {
    common_local = (compiler_common *)0x0;
  }
  return (PCRE2_SPTR16)common_local;
}

Assistant:

static SLJIT_INLINE PCRE2_SPTR compile_ref_iterator_matchingpath(compiler_common *common, PCRE2_SPTR cc, backtrack_common *parent)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
backtrack_common *backtrack;
PCRE2_UCHAR type;
int offset = 0;
struct sljit_label *label;
struct sljit_jump *zerolength;
struct sljit_jump *jump = NULL;
PCRE2_SPTR ccbegin = cc;
int min = 0, max = 0;
BOOL minimize;

PUSH_BACKTRACK(sizeof(ref_iterator_backtrack), cc, NULL);

if (ref)
  offset = GET2(cc, 1) << 1;
else
  cc += IMM2_SIZE;
type = cc[1 + IMM2_SIZE];

SLJIT_COMPILE_ASSERT((OP_CRSTAR & 0x1) == 0, crstar_opcode_must_be_even);
minimize = (type & 0x1) != 0;
switch(type)
  {
  case OP_CRSTAR:
  case OP_CRMINSTAR:
  min = 0;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRPLUS:
  case OP_CRMINPLUS:
  min = 1;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRQUERY:
  case OP_CRMINQUERY:
  min = 0;
  max = 1;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRRANGE:
  case OP_CRMINRANGE:
  min = GET2(cc, 1 + IMM2_SIZE + 1);
  max = GET2(cc, 1 + IMM2_SIZE + 1 + IMM2_SIZE);
  cc += 1 + IMM2_SIZE + 1 + 2 * IMM2_SIZE;
  break;
  default:
  SLJIT_UNREACHABLE();
  break;
  }

if (!minimize)
  {
  if (min == 0)
    {
    allocate_stack(common, 2);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);
    /* Temporary release of STR_PTR. */
    OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    /* Handles both invalid and empty cases. Since the minimum repeat,
    is zero the invalid case is basically the same as an empty case. */
    if (ref)
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    else
      {
      compile_dnref_search(common, ccbegin, NULL);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    /* Restore if not zero length. */
    OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    }
  else
    {
    allocate_stack(common, 1);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    if (ref)
      {
      add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
      }
    else
      {
      compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    }

  if (min > 1 || max > 1)
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, SLJIT_IMM, 0);

  label = LABEL();
  if (!ref)
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1);
  compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, FALSE, FALSE);

  if (min > 1 || max > 1)
    {
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0);
    OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, TMP1, 0);
    if (min > 1)
      CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, label);
    if (max > 1)
      {
      jump = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, max);
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      JUMPTO(SLJIT_JUMP, label);
      JUMPHERE(jump);
      }
    }

  if (max == 0)
    {
    /* Includes min > 1 case as well. */
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    JUMPTO(SLJIT_JUMP, label);
    }

  JUMPHERE(zerolength);
  BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();

  count_match(common);
  return cc;
  }

allocate_stack(common, ref ? 2 : 3);
if (ref)
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
if (type != OP_CRMINSTAR)
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);

if (min == 0)
  {
  /* Handles both invalid and empty cases. Since the minimum repeat,
  is zero the invalid case is basically the same as an empty case. */
  if (ref)
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    {
    compile_dnref_search(common, ccbegin, NULL);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  /* Length is non-zero, we can match real repeats. */
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
  jump = JUMP(SLJIT_JUMP);
  }
else
  {
  if (ref)
    {
    add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    }
  else
    {
    compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  }

BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();
if (max > 0)
  add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_GREATER_EQUAL, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, max));

if (!ref)
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(2));
compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, TRUE, TRUE);
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);

if (min > 1)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(1));
  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), TMP1, 0);
  CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, BACKTRACK_AS(ref_iterator_backtrack)->matchingpath);
  }
else if (max > 0)
  OP2(SLJIT_ADD, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 1);

if (jump != NULL)
  JUMPHERE(jump);
JUMPHERE(zerolength);

count_match(common);
return cc;
}